

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O2

QRect __thiscall
QGraphicsItemEffectSourcePrivate::deviceRect(QGraphicsItemEffectSourcePrivate *this)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect QVar1;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->info == (QGraphicsItemPaintInfo *)0x0) ||
     (this_00 = this->info->widget, this_00 == (QWidget *)0x0)) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning
              (local_30,
               "QGraphicsEffectSource::deviceRect: Not yet implemented, lacking device context");
    QVar1 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    QVar1 = QWidget::rect(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect deviceRect() const override
    {
        if (!info || !info->widget) {
            qWarning("QGraphicsEffectSource::deviceRect: Not yet implemented, lacking device context");
            return QRect();
        }
        return info->widget->rect();
    }